

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O0

void tchecker::refdbm::asynchronous_open_up(db_t *rdbm,reference_clock_variables_t *r)

{
  bool bVar1;
  uint uVar2;
  clock_id_t cVar3;
  size_t sVar4;
  uint local_28;
  uint local_24;
  clock_id_t x;
  clock_id_t t;
  clock_id_t refcount;
  clock_id_t rdim;
  reference_clock_variables_t *r_local;
  db_t *rdbm_local;
  
  if (rdbm == (db_t *)0x0) {
    __assert_fail("rdbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2bf,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar1 = is_consistent(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2c0,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar1 = is_tight(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2c1,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  sVar4 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)r);
  uVar2 = (uint)sVar4;
  cVar3 = reference_clock_variables_t::refcount(r);
  for (local_24 = 0; local_24 < cVar3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
      rdbm[local_28 * uVar2 + local_24] = (db_t)0x7ffffffe;
    }
    rdbm[local_24 * uVar2 + local_24] = (db_t)0x1;
  }
  bVar1 = is_consistent(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2ce,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar1 = is_tight(rdbm,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x2cf,
                  "void tchecker::refdbm::asynchronous_open_up(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  return;
}

Assistant:

void asynchronous_open_up(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r)
{
  assert(rdbm != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));

  // x - r < inf for all clock x and reference clock r (including x being a
  // reference clock)
  tchecker::clock_id_t const rdim = r.size();
  tchecker::clock_id_t const refcount = r.refcount();

  for (tchecker::clock_id_t t = 0; t < refcount; ++t) {
    for (tchecker::clock_id_t x = 0; x < rdim; ++x)
      RDBM(x, t) = tchecker::dbm::LT_INFINITY;
    RDBM(t, t) = tchecker::dbm::LE_ZERO;
  }

  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));
}